

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintgb.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::VarIntGB<false>::decodeArray
          (VarIntGB<false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  uint uVar2;
  ushort uVar3;
  uint3 uVar4;
  uint32_t *in_00;
  byte bVar5;
  uint32_t *out_00;
  uint uVar6;
  uint32_t uVar7;
  byte bVar8;
  
  uVar2 = *in;
  in_00 = in + 1;
  *nvalue = (ulong)uVar2;
  out_00 = out;
  while ((uint32_t *)((long)in_00 + 0x11U) < in + length) {
    in_00 = (uint32_t *)decodeGroupVarInt(this,(uint8_t *)in_00,out_00);
    out_00 = out_00 + 4;
  }
  while (in_00 < in + length) {
    bVar5 = (byte)*in_00;
    in_00 = (uint32_t *)((long)in_00 + 1);
    for (uVar6 = 0; (out_00 < out + uVar2 && (uVar6 < 4)); uVar6 = uVar6 + 1) {
      uVar7 = (uint32_t)(byte)*in_00;
      bVar8 = bVar5 & 3;
      if (bVar8 == 0) {
        in_00 = (uint32_t *)((long)in_00 + 1);
      }
      else {
        uVar3 = CONCAT11(*(byte *)((long)in_00 + 1),(byte)*in_00);
        uVar7 = (uint32_t)uVar3;
        if (bVar8 == 1) {
          in_00 = (uint32_t *)((long)in_00 + 2);
        }
        else {
          uVar4 = CONCAT12(*(byte *)((long)in_00 + 2),uVar3);
          uVar7 = (uint32_t)uVar4;
          if (bVar8 == 3) {
            pbVar1 = (byte *)((long)in_00 + 3);
            in_00 = in_00 + 1;
            uVar7 = CONCAT13(*pbVar1,uVar4);
          }
          else {
            in_00 = (uint32_t *)((long)in_00 + 3);
          }
        }
      }
      *out_00 = uVar7;
      bVar5 = bVar5 >> 2;
      out_00 = out_00 + 1;
    }
  }
  return (uint32_t *)((ulong)((long)in_00 + 3) & 0xfffffffffffffffc);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) {
    uint32_t prev = 0; // for delta

    const uint8_t *inbyte = reinterpret_cast<const uint8_t *>(in);
    nvalue = *in;
    inbyte += 4;

    const uint8_t *const endbyte =
        reinterpret_cast<const uint8_t *>(in + length);
    const uint32_t *const endout(out + nvalue);
    uint32_t val;

    while (endbyte > inbyte + 1 + 4 * 4) {
      inbyte = delta ? decodeGroupVarIntDelta(inbyte, &prev, out)
                     : decodeGroupVarInt(inbyte, out);
      out += 4;
    }
    while (endbyte > inbyte) {
      uint8_t key = *inbyte++;
      for (int k = 0; out < endout and k < 4; k++) {
        const uint32_t howmanybyte = key & 3;
        key = static_cast<uint8_t>(key >> 2);
        val = static_cast<uint32_t>(*inbyte++);
        if (howmanybyte >= 1) {
          val |= (static_cast<uint32_t>(*inbyte++) << 8);
          if (howmanybyte >= 2) {
            val |= (static_cast<uint32_t>(*inbyte++) << 16);
            if (howmanybyte >= 3) {
              val |= (static_cast<uint32_t>(*inbyte++) << 24);
            }
          }
        }
        prev = (delta ? prev : 0) + val;
        *out++ = prev;
      }
      assert(inbyte <= endbyte);
    }
    inbyte = padTo32bits(inbyte);
    return reinterpret_cast<const uint32_t *>(inbyte);
  }